

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

int nsvg__parseTransformArgs(char *str,float *args,int maxNa,int *na)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  char local_88 [8];
  char it [64];
  char *local_40;
  char *ptr;
  char *end;
  int *na_local;
  int maxNa_local;
  float *args_local;
  char *str_local;
  
  *na = 0;
  local_40 = str;
  while( true ) {
    bVar2 = false;
    if (*local_40 != '\0') {
      bVar2 = *local_40 != '(';
    }
    if (!bVar2) break;
    local_40 = local_40 + 1;
  }
  if (*local_40 == '\0') {
    str_local._4_4_ = 1;
  }
  else {
    ptr = local_40;
    while( true ) {
      bVar2 = false;
      if (*ptr != '\0') {
        bVar2 = *ptr != ')';
      }
      if (!bVar2) break;
      ptr = ptr + 1;
    }
    if (*ptr == '\0') {
      str_local._4_4_ = 1;
    }
    else {
      while (local_40 < ptr) {
        if ((((*local_40 == '-') || (*local_40 == '+')) || (*local_40 == '.')) ||
           (iVar1 = nsvg__isdigit(*local_40), iVar1 != 0)) {
          if (maxNa <= *na) {
            return 0;
          }
          local_40 = nsvg__parseNumber(local_40,local_88,0x40);
          dVar3 = nsvg__atof(local_88);
          iVar1 = *na;
          *na = iVar1 + 1;
          args[iVar1] = (float)dVar3;
        }
        else {
          local_40 = local_40 + 1;
        }
      }
      str_local._4_4_ = (int)ptr - (int)str;
    }
  }
  return str_local._4_4_;
}

Assistant:

static int nsvg__parseTransformArgs(const char* str, float* args, int maxNa, int* na)
{
	const char* end;
	const char* ptr;
	char it[64];

	*na = 0;
	ptr = str;
	while (*ptr && *ptr != '(') ++ptr;
	if (*ptr == 0)
		return 1;
	end = ptr;
	while (*end && *end != ')') ++end;
	if (*end == 0)
		return 1;

	while (ptr < end) {
		if (*ptr == '-' || *ptr == '+' || *ptr == '.' || nsvg__isdigit(*ptr)) {
			if (*na >= maxNa) return 0;
			ptr = nsvg__parseNumber(ptr, it, 64);
			args[(*na)++] = (float)nsvg__atof(it);
		} else {
			++ptr;
		}
	}
	return (int)(end - str);
}